

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptBigInt.cpp
# Opt level: O1

JavascriptBigInt *
Js::JavascriptBigInt::Create
          (char16 *content,charcount_t cchUseLength,bool isNegative,ScriptContext *scriptContext)

{
  Recycler *alloc;
  JavascriptBigInt *this;
  undefined1 local_58 [8];
  TrackAllocData data;
  
  local_58 = (undefined1  [8])&typeinfo;
  data.typeinfo = (type_info *)0x0;
  data.plusSize = 0xffffffffffffffff;
  data.count = (size_t)anon_var_dwarf_82f5f8c;
  data.filename._0_4_ = 0xb;
  alloc = Memory::Recycler::TrackAllocInfo(scriptContext->recycler,(TrackAllocData *)local_58);
  this = (JavascriptBigInt *)new<Memory::Recycler>(0x30,alloc,0x38bbb2);
  JavascriptBigInt(this,content,cchUseLength,isNegative,
                   (((scriptContext->super_ScriptContextBase).javascriptLibrary)->bigintTypeStatic).
                   ptr);
  return this;
}

Assistant:

JavascriptBigInt * JavascriptBigInt::Create(const char16 * content, charcount_t cchUseLength, bool isNegative, ScriptContext * scriptContext)
    {
        return RecyclerNew(scriptContext->GetRecycler(), JavascriptBigInt, content, cchUseLength, isNegative, scriptContext->GetLibrary()->GetBigIntTypeStatic());
    }